

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O1

void __thiscall chrono::ChMarker::Impose_Abs_Coord(ChMarker *this,Coordsys *m_coord)

{
  ChBody *pCVar1;
  Coordsys csys;
  ChQuaternion<double> local_88;
  Coordsys local_68;
  
  pCVar1 = this->Body;
  local_68.pos.m_data[2] = 0.0;
  local_68.pos.m_data[0] = 0.0;
  local_68.pos.m_data[1] = 0.0;
  local_68.rot.m_data[0] = 1.0;
  local_68.rot.m_data[1] = 0.0;
  local_68.rot.m_data[2] = 0.0;
  local_68.rot.m_data[3] = 0.0;
  ChTransform<double>::TransformParentToLocal
            (&m_coord->pos,
             &(pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
              pos,&(pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                   Amatrix);
  Qconjugate(&(pCVar1->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.
              rot);
  Qcross(&local_88,&m_coord->rot);
  Impose_Rel_Coord(this,&local_68);
  return;
}

Assistant:

void ChMarker::Impose_Abs_Coord(const Coordsys& m_coord) {
    ChBody* my_body;
    my_body = GetBody();

    Coordsys csys;
    // coordsys: transform the representation from the parent reference frame
    // to the local reference frame.
    csys.pos = ChTransform<>::TransformParentToLocal(m_coord.pos, my_body->GetCoord().pos, my_body->GetA());
    csys.rot = Qcross(Qconjugate(my_body->GetCoord().rot), m_coord.rot);
    // apply the imposition on local  coordinate and resting coordinate:
    Impose_Rel_Coord(csys);
}